

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,StackStream<char> *os)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  bool local_53;
  byte local_52;
  bool local_51;
  size_t offset;
  uint local_38;
  uint codepoint2;
  uint codepoint;
  Ch e;
  size_t escapeOffset;
  Ch c;
  StackStream<char> *os_local;
  GenericStringStream<rapidjson::UTF8<char>_> *is_local;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  do {
    do {
      while( true ) {
        while( true ) {
          ScanCopyUnescapedString<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                    (is,os);
          bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(is);
          if (bVar1 != 0x5c) break;
          sVar4 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(is);
          GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
          bVar1 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(is);
          if (""[bVar1] == '\0') {
            if (bVar1 == 0x75) {
              GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
              local_38 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                                   (this,is,sVar4);
              bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                       *)this);
              if (bVar2) {
                return;
              }
              local_51 = 0xd7ff < local_38 && local_38 < 0xdc00;
              if (local_51) {
                bVar2 = Consume<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,'\\');
                local_52 = 1;
                if (bVar2) {
                  bVar2 = Consume<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,'u');
                  local_52 = bVar2 ^ 0xff;
                }
                if ((local_52 & 1) != 0) {
                  bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                          ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                           *)this);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    __assert_fail("!HasParseError()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                                  ,0x405,
                                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                                 );
                  }
                  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this,kParseErrorStringUnicodeSurrogateInvalid,sVar4);
                  bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                          ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                           *)this);
                  if (bVar2) {
                    return;
                  }
                }
                uVar3 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                                  (this,is,sVar4);
                bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                        ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                         *)this);
                if (bVar2) {
                  return;
                }
                local_53 = uVar3 < 0xdc00 || 0xdfff < uVar3;
                if (local_53) {
                  bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                          ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                           *)this);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    __assert_fail("!HasParseError()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                                  ,0x409,
                                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                                 );
                  }
                  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this,kParseErrorStringUnicodeSurrogateInvalid,sVar4);
                  bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                          ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                           *)this);
                  if (bVar2) {
                    return;
                  }
                }
                local_38 = ((local_38 - 0xd800) * 0x400 | uVar3 - 0xdc00) + 0x10000;
              }
              UTF8<char>::
              Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                        (os,local_38);
            }
            else {
              bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                       *)this);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                              ,0x40f,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                             );
              }
              GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this,kParseErrorStringEscapeInvalid,sVar4);
              bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                      ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                       *)this);
              if (bVar2) {
                return;
              }
            }
          }
          else {
            GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
            GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            StackStream<char>::Put(os,""[bVar1]);
          }
        }
        if (bVar1 == 0x22) {
          GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          StackStream<char>::Put(os,'\0');
          return;
        }
        if (0x1f < bVar1) break;
        if (bVar1 == 0) {
          bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                          ,0x418,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                         );
          }
          sVar4 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(is);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)this,kParseErrorStringMissQuotationMark,sVar4);
          bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (bVar2) {
            return;
          }
        }
        else {
          bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                          ,0x41a,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                         );
          }
          sVar4 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(is);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)this,kParseErrorStringInvalidEncoding,sVar4);
          bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (bVar2) {
            return;
          }
        }
      }
      sVar4 = GenericStringStream<rapidjson::UTF8<char>_>::Tell(is);
      bVar2 = Transcoder<rapidjson::UTF8<char>,rapidjson::UTF8<char>>::
              Transcode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                        (is,os);
    } while (((bVar2 ^ 0xffU) & 1) == 0);
    bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/reader.h"
                    ,0x421,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                   );
    }
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this,kParseErrorStringInvalidEncoding,sVar4);
    bVar2 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this);
  } while (!bVar2);
  return;
}

Assistant:

RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, '/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the initial '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if ((parseFlags & kParseEscapedApostropheFlag) && RAPIDJSON_LIKELY(e == '\'')) { // Allow escaped apostrophe
                    is.Take();
                    os.Put('\'');
                }
                else if (RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDBFF)) {
                        // Handle UTF-16 surrogate pair
                        if (RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        unsigned codepoint2 = ParseHex4(is, escapeOffset);
                        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                        if (RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                            RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }